

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valence_cache.h
# Opt level: O0

void __thiscall
draco::ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate
          (ValenceCache<draco::CornerTable> *this)

{
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>
  *in_stack_ffffffffffffffb8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>
  *this_00;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>
  local_20;
  
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>::clear
            ((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>
              *)0x18aa3c);
  this_00 = &local_20;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>::
  IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>
                   *)0x18aa4b);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>::swap
            (this_00,in_stack_ffffffffffffffb8);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>::
  ~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char>
                    *)0x18aa66);
  return;
}

Assistant:

void ClearValenceCacheInaccurate() const {
    vertex_valence_cache_8_bit_.clear();
    // Force erasure.
    IndexTypeVector<VertexIndex, int8_t>().swap(vertex_valence_cache_8_bit_);
  }